

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_loadDict(LZ4_stream_t *LZ4_dict,char *dictionary,int dictSize)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  reg_t rVar4;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  BYTE *base;
  BYTE *dictEnd;
  BYTE *p;
  tableType_t tableType;
  LZ4_stream_t_internal *dict;
  U32 h;
  U16 *hashTable_2;
  U32 *hashTable_1;
  BYTE **hashTable;
  U64 prime8bytes;
  U64 prime5bytes;
  U32 hashLog;
  undefined8 local_e0;
  undefined4 local_b0;
  undefined4 local_10;
  
  lVar2 = (long)in_RSI + (long)in_EDX;
  LZ4_resetStream((LZ4_stream_t *)0x1c981d);
  *(int *)(in_RDI + 0x4000) = *(int *)(in_RDI + 0x4000) + 0x10000;
  if (in_EDX < 8) {
    local_b0 = 0;
  }
  else {
    local_e0 = in_RSI;
    if (0x10000 < lVar2 - (long)in_RSI) {
      local_e0 = (void *)(lVar2 + -0x10000);
    }
    lVar3 = lVar2 - (ulong)*(uint *)(in_RDI + 0x4000);
    *(void **)(in_RDI + 0x4008) = local_e0;
    *(int *)(in_RDI + 0x4018) = (int)lVar2 - (int)local_e0;
    *(undefined4 *)(in_RDI + 0x4004) = 2;
    for (; local_e0 <= (void *)(lVar2 - 8U); local_e0 = (void *)((long)local_e0 + 3)) {
      rVar4 = LZ4_read_ARCH(local_e0);
      uVar1 = LZ4_isLittleEndian();
      if (uVar1 == 0) {
        local_10 = (uint)((rVar4 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
      }
      else {
        local_10 = (uint)(rVar4 * -0x30e4432345000000 >> 0x20);
      }
      local_10 = local_10 >> 0x14;
      switch(0x1c9b07) {
      case 0:
        break;
      case 1:
        *(void **)(in_RDI + (ulong)local_10 * 8) = local_e0;
        break;
      case 2:
        *(int *)(in_RDI + (ulong)local_10 * 4) = (int)local_e0 - (int)lVar3;
        break;
      case 3:
        *(short *)(in_RDI + (ulong)local_10 * 2) = (short)local_e0 - (short)lVar3;
      }
    }
    local_b0 = *(int *)(in_RDI + 0x4018);
  }
  return local_b0;
}

Assistant:

int LZ4_loadDict (LZ4_stream_t* LZ4_dict, const char* dictionary, int dictSize)
{
    LZ4_stream_t_internal* dict = &LZ4_dict->internal_donotuse;
    const tableType_t tableType = byU32;
    const BYTE* p = (const BYTE*)dictionary;
    const BYTE* const dictEnd = p + dictSize;
    const BYTE* base;

    DEBUGLOG(4, "LZ4_loadDict (%i bytes from %p into %p)", dictSize, dictionary, LZ4_dict);

    /* It's necessary to reset the context,
     * and not just continue it with prepareTable()
     * to avoid any risk of generating overflowing matchIndex
     * when compressing using this dictionary */
    LZ4_resetStream(LZ4_dict);

    /* We always increment the offset by 64 KB, since, if the dict is longer,
     * we truncate it to the last 64k, and if it's shorter, we still want to
     * advance by a whole window length so we can provide the guarantee that
     * there are only valid offsets in the window, which allows an optimization
     * in LZ4_compress_fast_continue() where it uses noDictIssue even when the
     * dictionary isn't a full 64k. */
    dict->currentOffset += 64 KB;

    if (dictSize < (int)HASH_UNIT) {
        return 0;
    }

    if ((dictEnd - p) > 64 KB) p = dictEnd - 64 KB;
    base = dictEnd - dict->currentOffset;
    dict->dictionary = p;
    dict->dictSize = (U32)(dictEnd - p);
    dict->tableType = (U32)tableType;

    while (p <= dictEnd-HASH_UNIT) {
        LZ4_putPosition(p, dict->hashTable, tableType, base);
        p+=3;
    }

    return (int)dict->dictSize;
}